

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

double __thiscall Graph::minVoltage(Graph *this)

{
  Vertex *pVVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = 1.0;
  while (pVVar1 = this->verticesList, pVVar1 != (Vertex *)0x0) {
    dVar2 = pVVar1->voltage;
    if (dVar3 <= pVVar1->voltage) {
      dVar2 = dVar3;
    }
    dVar3 = dVar2;
    this = (Graph *)&pVVar1->nextVertex;
  }
  return dVar3;
}

Assistant:

double Graph::minVoltage(){
    double tension_minimum = 1.0;
    for(Vertex *no=this->verticesList; no!=NULL; no= no->getNext()){
        if(no->getVoltage() < tension_minimum)
            tension_minimum = no->getVoltage();
    }
    return tension_minimum;
}